

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall pugi::xml_node::prepend_attribute(xml_node *this,char_t *name_)

{
  xml_node_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  xml_attribute_struct *pxVar3;
  uint uVar4;
  xml_allocator *alloc;
  xml_attribute_struct *pxVar5;
  xml_attribute a;
  xml_attribute local_20;
  
  pxVar1 = this->_root;
  if ((pxVar1 == (xml_node_struct *)0x0) ||
     ((uVar4 = (uint)pxVar1->header & 0xf, uVar4 != 7 && (uVar4 != 2)))) {
    pxVar5 = (xml_attribute_struct *)0x0;
  }
  else {
    alloc = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(pxVar1);
    pxVar5 = impl::anon_unknown_0::allocate_attribute(alloc);
    if (pxVar5 != (xml_attribute_struct *)0x0) {
      pxVar1 = this->_root;
      pxVar2 = pxVar1->first_attribute;
      pxVar3 = pxVar5;
      if (pxVar2 != (xml_attribute_struct *)0x0) {
        pxVar5->prev_attribute_c = pxVar2->prev_attribute_c;
        pxVar3 = pxVar2;
      }
      pxVar3->prev_attribute_c = pxVar5;
      pxVar5->next_attribute = pxVar2;
      pxVar1->first_attribute = pxVar5;
      local_20._attr = pxVar5;
      xml_attribute::set_name(&local_20,name_);
    }
  }
  return (xml_attribute)pxVar5;
}

Assistant:

PUGI__FN xml_attribute xml_node::prepend_attribute(const char_t* name_)
	{
		if (!impl::allow_insert_attribute(type())) return xml_attribute();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(alloc));
		if (!a) return xml_attribute();

		impl::prepend_attribute(a._attr, _root);

		a.set_name(name_);

		return a;
	}